

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O3

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)2>::
async_prw<long(*)(int,void*,unsigned_long,long)>
          (basic_random_coro_file<(coro_io::execution_type)2> *this,
          _func_long_int_void_ptr_unsigned_long_long *io_func,bool is_read,size_t offset,char *buf,
          size_t size)

{
  _func_int **pp_Var1;
  undefined7 in_register_00000011;
  _func_int *in_stack_00000008;
  
  pp_Var1 = (_func_int **)operator_new(0xe0,(nothrow_t *)&std::nothrow);
  if (pp_Var1 == (_func_int **)0x0) {
    (this->executor_wrapper_).super_Executor._vptr_Executor = (_func_int **)0x0;
  }
  else {
    *pp_Var1 = async_prw<long(*)(int,void*,unsigned_long,long)>;
    pp_Var1[1] = async_prw<long(*)(int,void*,unsigned_long,long)>;
    pp_Var1[0x19] = in_stack_00000008;
    pp_Var1[0x18] = (_func_int *)size;
    pp_Var1[0x17] = (_func_int *)buf;
    *(char *)((long)pp_Var1 + 0xd9) = (char)offset;
    pp_Var1[0x16] = (_func_int *)CONCAT71(in_register_00000011,is_read);
    pp_Var1[0x15] = (_func_int *)io_func;
    pp_Var1[2] = (_func_int *)0x0;
    pp_Var1[3] = (_func_int *)0x0;
    pp_Var1[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var1 + 8) = 0;
    (this->executor_wrapper_).super_Executor._vptr_Executor = pp_Var1;
    *(undefined1 *)(pp_Var1 + 0x1b) = 0;
  }
  return (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)
         (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)this;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_prw(
      auto io_func, bool is_read, size_t offset, char *buf, size_t size) {
    std::function<int()> func = [=, this] {
      int fd = *prw_random_file_;
      return io_func(fd, buf, size, offset);
    };

    std::error_code ec{};
    size_t op_size = 0;

    auto len_val = co_await coro_io::post(std::move(func), &executor_wrapper_);
    int len = len_val.value();
    if (len == 0) {
      if (is_read) {
        eof_ = true;
      }
    }
    else if (len > 0) {
      op_size = len;
    }
    else {
      ec = std::make_error_code(std::errc::io_error);
      op_size = len;
    }

    co_return std::make_pair(ec, op_size);
  }